

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O0

char * BinarySource_get_asciz(BinarySource *src)

{
  void *pvVar1;
  char *end;
  char *start;
  BinarySource *src_local;
  
  if (src->err == BSE_NO_ERROR) {
    src_local = (BinarySource *)((long)src->data + src->pos);
    pvVar1 = memchr(src_local,0,src->len - src->pos);
    if (pvVar1 == (void *)0x0) {
      src->err = BSE_OUT_OF_DATA;
      src_local = (BinarySource *)0x165b1a;
    }
    else {
      src->pos = (long)pvVar1 + src->pos + (1 - (long)src_local);
    }
  }
  else {
    src_local = (BinarySource *)0x165b1a;
  }
  return (char *)src_local;
}

Assistant:

const char *BinarySource_get_asciz(BinarySource *src)
{
    const char *start, *end;

    if (src->err)
        return "";

    start = here;
    end = memchr(start, '\0', src->len - src->pos);
    if (!end) {
        src->err = BSE_OUT_OF_DATA;
        return "";
    }

    advance(end + 1 - start);
    return start;
}